

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkreplyimpl.cpp
# Opt level: O0

void __thiscall
QNetworkReplyImplPrivate::emitUploadProgress
          (QNetworkReplyImplPrivate *this,qint64 bytesSent,qint64 bytesTotal)

{
  QNetworkReplyImpl *_t2;
  ulong uVar1;
  long lVar2;
  QNetworkReplyImplPrivate *in_RDX;
  QNetworkReplyImplPrivate *in_RSI;
  QNetworkReplyImplPrivate *in_RDI;
  QNetworkReplyImpl *q;
  
  _t2 = q_func(in_RDI);
  in_RDI->bytesUploaded = (qint64)in_RSI;
  if (((in_RDI->super_QNetworkReplyPrivate).emitAllUploadProgressSignals & 1U) == 0) {
    uVar1 = QElapsedTimer::isValid();
    if ((((uVar1 & 1) != 0) && (in_RSI != in_RDX)) &&
       (lVar2 = QElapsedTimer::elapsed(), lVar2 < 100)) {
      return;
    }
    QElapsedTimer::start();
  }
  pauseNotificationHandling(in_RDI);
  QNetworkReply::uploadProgress((QNetworkReply *)in_RDI,(qint64)in_RDX,(qint64)_t2);
  resumeNotificationHandling(in_RSI);
  return;
}

Assistant:

void QNetworkReplyImplPrivate::emitUploadProgress(qint64 bytesSent, qint64 bytesTotal)
{
    Q_Q(QNetworkReplyImpl);
    bytesUploaded = bytesSent;

    if (!emitAllUploadProgressSignals) {
        //choke signal emissions, except the first and last signals which are unconditional
        if (uploadProgressSignalChoke.isValid()) {
            if (bytesSent != bytesTotal && uploadProgressSignalChoke.elapsed() < progressSignalInterval) {
                return;
            }
        }
        uploadProgressSignalChoke.start();
    }

    pauseNotificationHandling();
    emit q->uploadProgress(bytesSent, bytesTotal);
    resumeNotificationHandling();
}